

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall indk::NeuralNet::doCreateNewScope(NeuralNet *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Neuron::doCreateNewScope(*(Neuron **)(p_Var1 + 2),0.0);
  }
  return;
}

Assistant:

void indk::NeuralNet::doCreateNewScope() {
    for (const auto& N: Neurons) N.second -> doCreateNewScope();
}